

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestTestsAreAddedToTheListThroughMacro::RunImpl
          (TestTestsAreAddedToTheListThroughMacro *this)

{
  TestResults *pTVar1;
  bool bVar2;
  Test *pTVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_80 [2];
  TestDetails local_40;
  TestTestsAreAddedToTheListThroughMacro *local_10;
  TestTestsAreAddedToTheListThroughMacro *this_local;
  
  local_10 = this;
  pTVar3 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::list1);
  bVar2 = UnitTest::Check<bool>(pTVar3 != (Test *)0x0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_40,*ppTVar5,0x15);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_40,"list1.GetHead() != 0");
  }
  pTVar3 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::list1);
  bVar2 = UnitTest::Check<bool>(pTVar3->next == (Test *)0x0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_80,*ppTVar5,0x16);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_80,"list1.GetHead()->next == 0");
  }
  return;
}

Assistant:

TEST (TestsAreAddedToTheListThroughMacro)
{
    CHECK(list1.GetHead() != 0);
    CHECK(list1.GetHead()->next == 0);
}